

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_header.c
# Opt level: O0

exr_result_t
internal_exr_compute_tile_information(exr_context_t ctxt,exr_priv_part_t curpart,int rebuild)

{
  ulong uVar1;
  ulong uVar2;
  uint *puVar3;
  exr_result_t eVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int64_t iVar9;
  int in_EDX;
  long in_RSI;
  char *in_RDI;
  int64_t sy;
  int32_t l_1;
  int64_t sx;
  int32_t l;
  int32_t *levszY;
  int32_t *levszX;
  int32_t *levcntY;
  int32_t *levcntX;
  int32_t numY;
  int32_t numX;
  int64_t h;
  int64_t w;
  exr_attr_tiledesc_t *tiledesc;
  exr_attr_box2i_t dw;
  exr_result_t rv;
  int64_t local_a8;
  int64_t local_a0;
  int local_84;
  int local_74;
  int local_50;
  int local_4c;
  int local_30;
  int iStack_2c;
  int local_28;
  int iStack_24;
  exr_result_t local_4;
  
  if (((*(int *)(in_RSI + 4) == 0) || (*(int *)(in_RSI + 4) == 2)) || (*(int *)(in_RSI + 4) == 5)) {
    local_4 = 0;
  }
  else if ((*in_RDI == '\x04') && (*(long *)(in_RSI + 0x60) == 0)) {
    local_4 = 0;
  }
  else if ((in_EDX == 0) || ((*(long *)(in_RSI + 0x30) != 0 && (*(long *)(in_RSI + 0x60) != 0)))) {
    if (*(long *)(in_RSI + 0x60) == 0) {
      local_4 = (**(code **)(in_RDI + 0x38))(in_RDI,0xd);
    }
    else {
      if ((in_EDX != 0) && (*(long *)(in_RSI + 200) != 0)) {
        (**(code **)(in_RDI + 0x60))(*(undefined8 *)(in_RSI + 200));
        *(undefined8 *)(in_RSI + 200) = 0;
      }
      if (*(long *)(in_RSI + 200) == 0) {
        uVar1 = *(ulong *)(in_RSI + 0x90);
        uVar2 = *(ulong *)(in_RSI + 0x98);
        puVar3 = *(uint **)(*(long *)(in_RSI + 0x60) + 0x18);
        local_28 = (int)uVar2;
        local_30 = (int)uVar1;
        lVar5 = ((long)local_28 - (long)local_30) + 1;
        iStack_24 = (int)(uVar2 >> 0x20);
        iStack_2c = (int)(uVar1 >> 0x20);
        local_a8 = ((long)iStack_24 - (long)iStack_2c) + 1;
        if ((*puVar3 == 0) || (puVar3[1] == 0)) {
          eVar4 = (**(code **)(in_RDI + 0x38))(in_RDI,0xe);
          return eVar4;
        }
        switch((byte)puVar3[2] & 0xf) {
        case 0:
          local_50 = 1;
          local_4c = 1;
          break;
        case 1:
          if ((int)(uint)(byte)puVar3[2] >> 4 == 0) {
            local_a0 = local_a8;
            if (local_a8 < lVar5) {
              local_a0 = lVar5;
            }
            local_4c = floor_log2(local_a0);
          }
          else {
            if (local_a8 < lVar5) {
              local_a8 = lVar5;
            }
            local_4c = ceil_log2(local_a8);
          }
          local_4c = local_4c + 1;
          local_50 = local_4c;
          break;
        case 2:
          if ((int)(uint)(byte)puVar3[2] >> 4 == 0) {
            local_4c = floor_log2(lVar5);
            local_50 = floor_log2(local_a8);
          }
          else {
            local_4c = ceil_log2(lVar5);
            local_50 = ceil_log2(local_a8);
          }
          local_4c = local_4c + 1;
          local_50 = local_50 + 1;
          break;
        case 3:
        default:
          eVar4 = (**(code **)(in_RDI + 0x38))(in_RDI,0xe);
          return eVar4;
        }
        *(int *)(in_RSI + 0xc0) = local_4c;
        *(int *)(in_RSI + 0xc4) = local_50;
        lVar5 = (**(code **)(in_RDI + 0x58))((long)(local_4c + local_50) << 3);
        if (lVar5 == 0) {
          eVar4 = (**(code **)(in_RDI + 0x38))(in_RDI,1);
          return eVar4;
        }
        lVar6 = lVar5 + (long)local_4c * 4;
        lVar7 = lVar6 + (long)local_4c * 4;
        lVar8 = lVar7 + (long)local_50 * 4;
        for (local_74 = 0; local_74 < local_4c; local_74 = local_74 + 1) {
          iVar9 = calc_level_size((long)local_30,(long)local_28,local_74,
                                  (int)(uint)(byte)puVar3[2] >> 4);
          if ((iVar9 < 0) || (0x7fffffff < iVar9)) {
            eVar4 = (**(code **)(in_RDI + 0x48))
                              (in_RDI,0xe,
                               "Invalid data window x dims (%d, %d) resulting in invalid tile level size (%ld) for level %d"
                               ,uVar1 & 0xffffffff,uVar2 & 0xffffffff,iVar9,local_74);
            return eVar4;
          }
          *(int *)(lVar5 + (long)local_74 * 4) =
               (int)(((iVar9 + (ulong)*puVar3) - 1) / (ulong)*puVar3);
          *(int *)(lVar6 + (long)local_74 * 4) = (int)iVar9;
        }
        for (local_84 = 0; local_84 < local_50; local_84 = local_84 + 1) {
          iVar9 = calc_level_size((long)iStack_2c,(long)iStack_24,local_84,
                                  (int)(uint)(byte)puVar3[2] >> 4);
          if ((iVar9 < 0) || (0x7fffffff < iVar9)) {
            eVar4 = (**(code **)(in_RDI + 0x48))
                              (in_RDI,0xe,
                               "Invalid data window y dims (%d, %d) resulting in invalid tile level size (%ld) for level %d"
                               ,iStack_2c,iStack_24,iVar9,local_84);
            return eVar4;
          }
          *(int *)(lVar7 + (long)local_84 * 4) =
               (int)(((iVar9 + (ulong)puVar3[1]) - 1) / (ulong)puVar3[1]);
          *(int *)(lVar8 + (long)local_84 * 4) = (int)iVar9;
        }
        *(long *)(in_RSI + 200) = lVar5;
        *(long *)(in_RSI + 0xd0) = lVar7;
        *(long *)(in_RSI + 0xd8) = lVar6;
        *(long *)(in_RSI + 0xe0) = lVar8;
      }
      local_4 = 0;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

exr_result_t
internal_exr_compute_tile_information (
    exr_context_t ctxt, exr_priv_part_t curpart, int rebuild)
{
    exr_result_t rv = EXR_ERR_SUCCESS;
    if (curpart->storage_mode == EXR_STORAGE_SCANLINE ||
        curpart->storage_mode == EXR_STORAGE_DEEP_SCANLINE ||
        curpart->storage_mode == EXR_STORAGE_UNKNOWN)
        return EXR_ERR_SUCCESS;

    if (ctxt->mode == EXR_CONTEXT_TEMPORARY && !curpart->tiles)
        return EXR_ERR_SUCCESS;

    if (rebuild && (!curpart->dataWindow || !curpart->tiles))
        return EXR_ERR_SUCCESS;

    if (!curpart->tiles)
        return ctxt->standard_error (ctxt, EXR_ERR_MISSING_REQ_ATTR);

    if (rebuild)
    {
        if (curpart->tile_level_tile_count_x)
        {
            ctxt->free_fn (curpart->tile_level_tile_count_x);
            curpart->tile_level_tile_count_x = NULL;
        }
    }

    if (curpart->tile_level_tile_count_x == NULL)
    {
        const exr_attr_box2i_t     dw       = curpart->data_window;
        const exr_attr_tiledesc_t* tiledesc = curpart->tiles->tiledesc;
        int64_t                    w, h;
        int32_t                    numX, numY;
        int32_t*                   levcntX = NULL;
        int32_t*                   levcntY = NULL;
        int32_t*                   levszX  = NULL;
        int32_t*                   levszY  = NULL;

        w = ((int64_t) dw.max.x) - ((int64_t) dw.min.x) + 1;
        h = ((int64_t) dw.max.y) - ((int64_t) dw.min.y) + 1;

        if (tiledesc->x_size == 0 || tiledesc->y_size == 0)
            return ctxt->standard_error (ctxt, EXR_ERR_INVALID_ATTR);
        switch (EXR_GET_TILE_LEVEL_MODE ((*tiledesc)))
        {
            case EXR_TILE_ONE_LEVEL: numX = numY = 1; break;
            case EXR_TILE_MIPMAP_LEVELS:
                if (EXR_GET_TILE_ROUND_MODE ((*tiledesc)) ==
                    EXR_TILE_ROUND_DOWN)
                {
                    numX = floor_log2 (w > h ? w : h) + 1;
                    numY = numX;
                }
                else
                {
                    numX = ceil_log2 (w > h ? w : h) + 1;
                    numY = numX;
                }
                break;
            case EXR_TILE_RIPMAP_LEVELS:
                if (EXR_GET_TILE_ROUND_MODE ((*tiledesc)) ==
                    EXR_TILE_ROUND_DOWN)
                {
                    numX = floor_log2 (w) + 1;
                    numY = floor_log2 (h) + 1;
                }
                else
                {
                    numX = ceil_log2 (w) + 1;
                    numY = ceil_log2 (h) + 1;
                }
                break;
            case EXR_TILE_LAST_TYPE:
            default: return ctxt->standard_error (ctxt, EXR_ERR_INVALID_ATTR);
        }

        curpart->num_tile_levels_x = numX;
        curpart->num_tile_levels_y = numY;
        levcntX                    = (int32_t*) ctxt->alloc_fn (
            2 * (size_t) (numX + numY) * sizeof (int32_t));
        if (levcntX == NULL)
            return ctxt->standard_error (ctxt, EXR_ERR_OUT_OF_MEMORY);
        levszX  = levcntX + numX;
        levcntY = levszX + numX;
        levszY  = levcntY + numY;

        for (int32_t l = 0; l < numX; ++l)
        {
            int64_t sx = calc_level_size (
                dw.min.x, dw.max.x, l, EXR_GET_TILE_ROUND_MODE ((*tiledesc)));
            if (sx < 0 || sx > (int64_t) INT32_MAX)
                return ctxt->print_error (
                    ctxt,
                    EXR_ERR_INVALID_ATTR,
                    "Invalid data window x dims (%d, %d) resulting in invalid tile level size (%" PRId64
                    ") for level %d",
                    dw.min.x,
                    dw.max.x,
                    sx,
                    l);
            levcntX[l] = (int32_t) (((uint64_t) sx + tiledesc->x_size - 1) /
                                    tiledesc->x_size);
            levszX[l]  = (int32_t) sx;
        }

        for (int32_t l = 0; l < numY; ++l)
        {
            int64_t sy = calc_level_size (
                dw.min.y, dw.max.y, l, EXR_GET_TILE_ROUND_MODE ((*tiledesc)));
            if (sy < 0 || sy > (int64_t) INT32_MAX)
                return ctxt->print_error (
                    ctxt,
                    EXR_ERR_INVALID_ATTR,
                    "Invalid data window y dims (%d, %d) resulting in invalid tile level size (%" PRId64
                    ") for level %d",
                    dw.min.y,
                    dw.max.y,
                    sy,
                    l);
            levcntY[l] = (int32_t) (((uint64_t) sy + tiledesc->y_size - 1) /
                                    tiledesc->y_size);
            levszY[l]  = (int32_t) sy;
        }

        curpart->tile_level_tile_count_x = levcntX;
        curpart->tile_level_tile_count_y = levcntY;
        curpart->tile_level_tile_size_x  = levszX;
        curpart->tile_level_tile_size_y  = levszY;
    }
    return rv;
}